

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevolute.cpp
# Opt level: O3

void __thiscall chrono::ChLinkRevolute::ArchiveIN(ChLinkRevolute *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChFrame<double>_> specFuncA;
  char *local_58;
  undefined ***local_50;
  undefined1 local_48;
  undefined **local_40;
  ChFrame<double> *local_38;
  
  ChArchiveIn::VersionRead<chrono::ChLinkRevolute>(marchive);
  ChLink::ArchiveIN(&this->super_ChLink,marchive);
  local_38 = &this->m_frame1;
  local_58 = "m_frame1";
  local_48 = 0;
  local_40 = &PTR__ChFunctorArchiveIn_00b113c0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->m_frame2;
  local_40 = &PTR__ChFunctorArchiveIn_00b113c0;
  local_58 = "m_frame2";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  return;
}

Assistant:

void ChLinkRevolute::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkRevolute>();

    // deserialize parent class
    ChLink::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(m_frame1);
    marchive >> CHNVP(m_frame2);
}